

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPW91_LDA_RPA>
               (int N,const_host_buffer_type rho,host_buffer_type eps,host_buffer_type vxc)

{
  double *in_RCX;
  double in_RDX;
  double in_RSI;
  int in_EDI;
  host_buffer_type vxc_i;
  const_host_buffer_type rho_i;
  int32_t i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    lda_screening_interface<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_vxc_polar
              (in_RSI,in_RDX,in_RCX,(double *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
               (double *)((long)in_RSI + (long)(iVar1 << 1) * 8));
  }
  return;
}

Assistant:

LDA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;
    auto vxc_i = vxc + 2*i;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], eps[i], 
      vxc_i[0], vxc_i[1] );

  }

}